

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O0

bool __thiscall ON_3dmRevisionHistory::IsEmpty(ON_3dmRevisionHistory *this)

{
  bool bVar1;
  ON_3dmRevisionHistory *this_local;
  
  if ((((this->m_revision_count != 0) || (bVar1 = CreateTimeIsSet(this), bVar1)) ||
      (bVar1 = LastEditedTimeIsSet(this), bVar1)) ||
     ((bVar1 = ON_wString::IsEmpty(&this->m_sCreatedBy), !bVar1 ||
      (bVar1 = ON_wString::IsEmpty(&this->m_sLastEditedBy), !bVar1)))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmRevisionHistory::IsEmpty() const
{
  if ( 0 == m_revision_count
       && !CreateTimeIsSet()
       && !LastEditedTimeIsSet()
       && m_sCreatedBy.IsEmpty()
       && m_sLastEditedBy.IsEmpty()
     )
  {
    return true;
  }
  return false;
}